

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::SolveLinearSystem(MatrixNd *A,VectorNd *b,VectorNd *x,LinearSolver ls)

{
  Index IVar1;
  Index IVar2;
  undefined8 uVar3;
  string *text;
  void *this;
  int in_ECX;
  ostringstream errormsg;
  DenseBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffc18;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffc20;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffc28;
  SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffffc30;
  ostringstream *this_00;
  RBDLError *in_stack_fffffffffffffc40;
  allocator<char> *in_stack_fffffffffffffc50;
  string *in_stack_fffffffffffffc58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  ostringstream local_328 [440];
  Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_170;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_c0;
  Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_68;
  undefined1 local_55;
  int local_1c;
  
  local_1c = in_ECX;
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6d97d3);
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffc20
                    );
  if (IVar1 == IVar2) {
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x6d9805);
    IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       in_stack_fffffffffffffc20);
    if (IVar1 == IVar2) {
      if (local_1c == 1) {
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::partialPivLu
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffffc28);
        local_68 = Eigen::SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
                   solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                             ((SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                  ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc20,
                   (DenseBase<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)in_stack_fffffffffffffc18);
        Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU
                  ((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffffc20);
      }
      else if (local_1c == 2) {
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colPivHouseholderQr
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffffc28);
        local_c0 = Eigen::
                   SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
                   solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                             ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                  ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc20,
                   (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)in_stack_fffffffffffffc18);
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
                  (in_stack_fffffffffffffc20);
      }
      else {
        if (local_1c != 3) {
          this_00 = local_328;
          std::__cxx11::ostringstream::ostringstream(this_00);
          text = (string *)std::operator<<((ostream *)this_00,"Error: Invalid linear solver: ");
          this = (void *)std::ostream::operator<<(text,local_1c);
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
          uVar3 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          Errors::RBDLError::RBDLError(in_stack_fffffffffffffc40,text);
          __cxa_throw(uVar3,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
        }
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::householderQr
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffffc28);
        local_170 = Eigen::SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
                    solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
        Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                  ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc20,
                   in_stack_fffffffffffffc18);
        Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
                  ((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffffc20);
      }
      return;
    }
  }
  local_55 = 1;
  uVar3 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  Errors::RBDLSizeMismatchError::RBDLSizeMismatchError
            ((RBDLSizeMismatchError *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  local_55 = 0;
  __cxa_throw(uVar3,&Errors::RBDLSizeMismatchError::typeinfo,
              Errors::RBDLSizeMismatchError::~RBDLSizeMismatchError);
}

Assistant:

void SolveLinearSystem (
  const MatrixNd& A,
  const VectorNd& b,
  VectorNd& x,
  LinearSolver ls
)
{
  if(A.rows() != b.size() || A.cols() != x.size()) {
    throw Errors::RBDLSizeMismatchError("Mismatching sizes.\n");
  }

#ifdef RBDL_USE_CASADI_MATH
  auto linsol = casadi::Linsol("linear_solver", "symbolicqr", A.sparsity());
  x = linsol.solve(A, b);
#else
  // Solve the system A*x = b.
  switch (ls) {
  case (LinearSolverPartialPivLU) :
    x = A.partialPivLu().solve(b);
    break;
  case (LinearSolverColPivHouseholderQR) :
    x = A.colPivHouseholderQr().solve(b);
    break;
  case (LinearSolverHouseholderQR) :
    x = A.householderQr().solve(b);
    break;
  default:
    std::ostringstream errormsg;
    errormsg << "Error: Invalid linear solver: " << ls << std::endl;
    throw Errors::RBDLError(errormsg.str());
    break;
  }
#endif
}